

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::
string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
::load(string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       *this,handle src,bool param_2)

{
  bool bVar1;
  long lVar2;
  undefined7 in_register_00000011;
  long *local_50 [2];
  long local_40 [2];
  long local_30;
  Py_ssize_t size;
  
  if (src.m_ptr == (PyObject *)0x0) {
    bVar1 = false;
  }
  else {
    if (((src.m_ptr)->ob_type->tp_flags & 0x10000000) == 0) {
      bVar1 = load_bytes<char>(this,(enable_if_t<std::is_same<char,_char>::value,_handle>)src.m_ptr)
      ;
      return bVar1;
    }
    local_30 = -1;
    lVar2 = PyUnicode_AsUTF8AndSize(src.m_ptr,&local_30,CONCAT71(in_register_00000011,param_2));
    bVar1 = lVar2 != 0;
    if (lVar2 == 0) {
      PyErr_Clear();
    }
    else {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,lVar2,local_30 + lVar2);
      std::__cxx11::string::operator=((string *)this,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool) {
#if PY_MAJOR_VERSION < 3
        object temp;
#endif
        handle load_src = src;
        if (!src) {
            return false;
        }
        if (!PyUnicode_Check(load_src.ptr())) {
#if PY_MAJOR_VERSION >= 3
            return load_bytes(load_src);
#else
            if (std::is_same<CharT, char>::value) {
                return load_bytes(load_src);
            }

            // The below is a guaranteed failure in Python 3 when PyUnicode_Check returns false
            if (!PYBIND11_BYTES_CHECK(load_src.ptr()))
                return false;

            temp = reinterpret_steal<object>(PyUnicode_FromObject(load_src.ptr()));
            if (!temp) { PyErr_Clear(); return false; }
            load_src = temp;
#endif
        }

#if PY_VERSION_HEX >= 0x03030000
        // On Python >= 3.3, for UTF-8 we avoid the need for a temporary `bytes`
        // object by using `PyUnicode_AsUTF8AndSize`.
        if (PYBIND11_SILENCE_MSVC_C4127(UTF_N == 8)) {
            Py_ssize_t size = -1;
            const auto *buffer
                = reinterpret_cast<const CharT *>(PyUnicode_AsUTF8AndSize(load_src.ptr(), &size));
            if (!buffer) {
                PyErr_Clear();
                return false;
            }
            value = StringType(buffer, static_cast<size_t>(size));
            return true;
        }
#endif

        auto utfNbytes = reinterpret_steal<object>(PyUnicode_AsEncodedString(
            load_src.ptr(), UTF_N == 8 ? "utf-8" : UTF_N == 16 ? "utf-16" : "utf-32", nullptr));
        if (!utfNbytes) { PyErr_Clear(); return false; }

        const auto *buffer = reinterpret_cast<const CharT *>(PYBIND11_BYTES_AS_STRING(utfNbytes.ptr()));
        size_t length = (size_t) PYBIND11_BYTES_SIZE(utfNbytes.ptr()) / sizeof(CharT);
        // Skip BOM for UTF-16/32
        if (PYBIND11_SILENCE_MSVC_C4127(UTF_N > 8)) {
            buffer++;
            length--;
        }
        value = StringType(buffer, length);

        // If we're loading a string_view we need to keep the encoded Python object alive:
        if (IsView)
            loader_life_support::add_patient(utfNbytes);

        return true;
    }